

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_message.cpp
# Opt level: O0

uint32_t pstore::brokerface::next_message_id(void)

{
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  return (anonymous_namespace)::message_id;
}

Assistant:

std::uint32_t next_message_id () { return message_id.load (); }